

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O1

bool EOPlus::ctype_ident(char c)

{
  int iVar1;
  bool bVar2;
  
  if (c == '$') {
    bVar2 = false;
  }
  else {
    iVar1 = isalpha((int)c);
    bVar2 = true;
    if ((c != '_') && (iVar1 == 0)) {
      bVar2 = (int)c - 0x30U < 10;
    }
  }
  return bVar2;
}

Assistant:

bool ctype_ident(char c) { return c != '$' && (ctype_ident_start(c) || ctype_digit(c)); }